

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerGenerator.cc
# Opt level: O2

void __thiscall
InstructionInfo::generateFindInstructionNameElseIf(InstructionInfo *this,ostream *out)

{
  ostream *poVar1;
  
  generateElseIf(this,out,false);
  poVar1 = std::operator<<(out,"    return \"");
  poVar1 = std::operator<<(poVar1,(string *)this);
  std::operator<<(poVar1,"\";\n");
  return;
}

Assistant:

void InstructionInfo::generateFindInstructionNameElseIf(std::ostream& out)
{
    generateElseIf(out,false);
    out << "    return \"" << name << "\";\n";
}